

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O2

ChainstateLoadResult *
node::VerifyLoadedChainstate
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          ChainstateLoadOptions *options)

{
  uint uVar1;
  Chainstate *this;
  pointer ppCVar2;
  CBlockIndex *pCVar3;
  CChainParams *consensus_params;
  bool bVar4;
  VerifyDBResult VVar5;
  CCoinsViewCache *pCVar6;
  int64_t iVar7;
  CCoinsViewDB *coinsview;
  pointer ppCVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  ChainstateLoadStatus local_a4;
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_a0;
  unique_lock<std::recursive_mutex> local_88;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_88,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
             ,0xfd,false);
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_a0,chainman);
  ppCVar8 = local_a0._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar8 == local_a0._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_a0);
      local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
      local_78.original._M_string_length = 0;
      local_78.original.field_2._M_local_buf[0] = '\0';
      local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
      local_78.translated._M_string_length = 0;
      local_78.translated.field_2._M_local_buf[0] = '\0';
      bilingual_str::bilingual_str((bilingual_str *)__return_storage_ptr__,&local_78);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
      bilingual_str::~bilingual_str(&local_78);
LAB_00772303:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (options->wipe_chainstate_db != true) {
      this = *ppCVar8;
      pCVar6 = Chainstate::CoinsTip(this);
      (*(pCVar6->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_78,pCVar6);
      bVar4 = base_blob<256U>::IsNull((base_blob<256U> *)&local_78);
      if (!bVar4) {
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ppCVar2 ==
             (this->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start) ||
           (pCVar3 = ppCVar2[-1], pCVar3 == (CBlockIndex *)0x0)) {
LAB_007721ab:
          CVerifyDB::CVerifyDB((CVerifyDB *)&local_78,(chainman->m_options).notifications);
          consensus_params = (chainman->m_options).chainparams;
          coinsview = Chainstate::CoinsDB(this);
          VVar5 = CVerifyDB::VerifyDB((CVerifyDB *)&local_78,this,&consensus_params->consensus,
                                      &coinsview->super_CCoinsView,(int)options->check_level,
                                      (int)options->check_blocks);
          CVerifyDB::~CVerifyDB((CVerifyDB *)&local_78);
          if (VVar5 == SKIPPED_L3_CHECKS) {
            if (options->require_full_verification != true) goto LAB_00772215;
            local_a4 = FAILURE_INSUFFICIENT_DBCACHE;
            _(&local_78,(ConstevalStringLiteral)0xcb4065);
          }
          else if (VVar5 == CORRUPTED_BLOCK_DB) {
            local_a4 = FAILURE;
            _(&local_78,(ConstevalStringLiteral)0xcb4043);
          }
          else {
            if (VVar5 != INTERRUPTED) goto LAB_00772215;
            local_a4 = INTERRUPTED;
            _(&local_78,(ConstevalStringLiteral)0xcb4020);
          }
        }
        else {
          uVar1 = pCVar3->nTime;
          iVar7 = GetTime();
          if ((long)(ulong)uVar1 <= iVar7 + 0x1c20) goto LAB_007721ab;
          local_a4 = FAILURE;
          _(&local_78,(ConstevalStringLiteral)0xcb3f30);
        }
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  (__return_storage_ptr__,&local_a4,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_a0);
        goto LAB_00772303;
      }
    }
LAB_00772215:
    ppCVar8 = ppCVar8 + 1;
  } while( true );
}

Assistant:

ChainstateLoadResult VerifyLoadedChainstate(ChainstateManager& chainman, const ChainstateLoadOptions& options)
{
    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    LOCK(cs_main);

    for (Chainstate* chainstate : chainman.GetAll()) {
        if (!is_coinsview_empty(chainstate)) {
            const CBlockIndex* tip = chainstate->m_chain.Tip();
            if (tip && tip->nTime > GetTime() + MAX_FUTURE_BLOCK_TIME) {
                return {ChainstateLoadStatus::FAILURE, _("The block database contains a block which appears to be from the future. "
                                                         "This may be due to your computer's date and time being set incorrectly. "
                                                         "Only rebuild the block database if you are sure that your computer's date and time are correct")};
            }

            VerifyDBResult result = CVerifyDB(chainman.GetNotifications()).VerifyDB(
                *chainstate, chainman.GetConsensus(), chainstate->CoinsDB(),
                options.check_level,
                options.check_blocks);
            switch (result) {
            case VerifyDBResult::SUCCESS:
            case VerifyDBResult::SKIPPED_MISSING_BLOCKS:
                break;
            case VerifyDBResult::INTERRUPTED:
                return {ChainstateLoadStatus::INTERRUPTED, _("Block verification was interrupted")};
            case VerifyDBResult::CORRUPTED_BLOCK_DB:
                return {ChainstateLoadStatus::FAILURE, _("Corrupted block database detected")};
            case VerifyDBResult::SKIPPED_L3_CHECKS:
                if (options.require_full_verification) {
                    return {ChainstateLoadStatus::FAILURE_INSUFFICIENT_DBCACHE, _("Insufficient dbcache for block verification")};
                }
                break;
            } // no default case, so the compiler can warn about missing cases
        }
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}